

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall
QHexView::setBackgroundSize(QHexView *this,qint64 begin,qint64 length,QColor *bgcolor)

{
  QColor *bgcolor_local;
  qint64 length_local;
  qint64 begin_local;
  QHexView *this_local;
  
  QHexMetadata::setBackgroundSize(this->m_hexmetadata,begin,length,bgcolor);
  return;
}

Assistant:

void QHexView::setBackgroundSize(qint64 begin, qint64 length,
                                 const QColor& bgcolor) {
    m_hexmetadata->setBackgroundSize(begin, length, bgcolor);
}